

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O1

ssize_t __thiscall ymfm::opll_registers::write(opll_registers *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  byte bVar2;
  uint *in_R8;
  
  if (0x3f < (ushort)__fd) {
    return 0;
  }
  this->m_regdata[__fd & 0xffff] = (byte)__buf;
  if ((ushort)__fd == 0xe) {
    *(undefined4 *)__n = 0xff;
    uVar1 = (uint)__buf & 0xff;
    uVar1 = (int)(uVar1 << 0x1a) >> 0x1f & uVar1 & 0x1f;
  }
  else {
    if ((__fd & 0x30U) != 0x20) {
      return 0;
    }
    *(uint *)__n = __fd & 0xfU;
    if (8 < (__fd & 0xfU)) {
      return 0;
    }
    bVar2 = ((byte)__buf & 0x10) >> 4;
    uVar1 = (uint)bVar2 + (uint)bVar2 * 2;
  }
  *in_R8 = uVar1;
  return 1;
}

Assistant:

bool opll_registers::write(uint16_t index, uint8_t data, uint32_t &channel, uint32_t &opmask)
{
	// unclear the address is masked down to 6 bits or if writes above
	// the register top are ignored; assuming the latter for now
	if (index >= REGISTERS)
		return false;

	// write the new data
	m_regdata[index] = data;

	// handle writes to the rhythm keyons
	if (index == 0x0e)
	{
		channel = RHYTHM_CHANNEL;
		opmask = bitfield(data, 5) ? bitfield(data, 0, 5) : 0;
		return true;
	}

	// handle writes to the channel keyons
	if ((index & 0xf0) == 0x20)
	{
		channel = index & 0x0f;
		if (channel < CHANNELS)
		{
			opmask = bitfield(data, 4) ? 3 : 0;
			return true;
		}
	}
	return false;
}